

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Vocoder.cpp
# Opt level: O2

int Vocoder::ProcessCallback
              (UnityAudioEffectState *state,float *inbuffer,float *outbuffer,uint length,
              int inchannels,int outchannels)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  uint uVar4;
  EffectData *pEVar5;
  long lVar6;
  ulong uVar7;
  undefined1 *puVar8;
  EffectData *pEVar9;
  int i;
  ulong uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float local_94;
  float *local_78;
  float *local_48;
  
  pEVar5 = UnityAudioEffectState::GetEffectData<Vocoder::EffectData>(state);
  local_94 = powf(10.0,*(float *)&pEVar5->field_0 * 0.05 + 2.5);
  fVar11 = (float)(state->field_0).field_0.samplerate;
  fVar15 = fVar11 * 0.25;
  fVar11 = 1.0 / fVar11;
  fVar12 = powf(0.001,fVar11 / *(float *)((long)&pEVar5->field_0 + 0x14));
  fVar1 = *(float *)((long)&pEVar5->field_0 + 0x18);
  uVar7 = 0;
  uVar10 = (ulong)(uint)inchannels;
  if (inchannels < 1) {
    uVar10 = uVar7;
  }
  puVar8 = (undefined1 *)((long)&pEVar5->field_0 + 0x50);
  for (; uVar7 != 0xb; uVar7 = uVar7 + 1) {
    fVar13 = ((float)(&freqs)[uVar7] * *(float *)((long)&pEVar5->field_0 + 8) +
             *(float *)((long)&pEVar5->field_0 + 4)) * 0.25;
    fVar16 = 10.0;
    if ((10.0 <= fVar13) && (fVar16 = fVar13, fVar15 < fVar13)) {
      fVar16 = fVar15;
    }
    fVar16 = fVar16 * fVar11 * 1.5707964;
    uVar2 = *(undefined4 *)((long)&pEVar5->field_0 + 0xc);
    fVar13 = sinf(fVar16);
    uVar3 = *(undefined4 *)((long)&pEVar5->field_0 + 0x10);
    fVar16 = sinf(fVar16);
    for (lVar6 = 0; uVar10 * 0x2ec - lVar6 != 0; lVar6 = lVar6 + 0x2ec) {
      *(float *)(puVar8 + lVar6 + -0x34) = fVar13 + fVar13;
      *(float *)(puVar8 + lVar6 + -0x24) = fVar13 + fVar13;
      *(undefined4 *)(puVar8 + lVar6 + -0x30) = uVar2;
      *(undefined4 *)(puVar8 + lVar6 + -0x20) = uVar2;
      *(float *)(puVar8 + lVar6 + -0x14) = fVar16 + fVar16;
      *(float *)(puVar8 + lVar6 + -4) = fVar16 + fVar16;
      *(undefined4 *)(puVar8 + lVar6 + -0x10) = uVar3;
      *(undefined4 *)(puVar8 + lVar6) = uVar3;
    }
    local_94 = local_94 * fVar1;
    puVar8 = puVar8 + 0x44;
  }
  local_78 = (state->field_0).field_0.sidechainbuffer;
  local_48 = inbuffer;
  for (uVar4 = 0; uVar4 != length; uVar4 = uVar4 + 1) {
    pEVar9 = pEVar5;
    for (uVar7 = 0; uVar7 != uVar10; uVar7 = uVar7 + 1) {
      fVar1 = *local_48;
      fVar11 = *local_78;
      fVar15 = 0.0;
      for (lVar6 = 0; lVar6 != 0x2ec; lVar6 = lVar6 + 0x44) {
        fVar16 = StateVariableFilter::ProcessBPF
                           ((StateVariableFilter *)((long)&pEVar9->field_0 + lVar6 + 0x3c),
                            fVar1 * local_94 + 1e-11);
        fVar13 = StateVariableFilter::ProcessBPF
                           ((StateVariableFilter *)((long)&pEVar9->field_0 + lVar6 + 0x4c),fVar16);
        fVar16 = StateVariableFilter::ProcessBPF
                           ((StateVariableFilter *)((long)&pEVar9->field_0 + lVar6 + 0x1c),fVar11);
        fVar14 = StateVariableFilter::ProcessBPF
                           ((StateVariableFilter *)((long)&pEVar9->field_0 + lVar6 + 0x2c),fVar16);
        fVar16 = *(float *)((long)&pEVar9->field_0 + lVar6 + 0x5c);
        fVar16 = (ABS(fVar14) - fVar16) * (1.0 - fVar12) + 1e-11 + fVar16;
        *(float *)((long)&pEVar9->field_0 + lVar6 + 0x5c) = fVar16;
        fVar15 = fVar15 + fVar16 * fVar13;
      }
      local_48 = local_48 + 1;
      local_78 = local_78 + 1;
      *outbuffer = fVar15;
      outbuffer = outbuffer + 1;
      pEVar9 = (EffectData *)((long)&pEVar9->field_0 + 0x2ec);
    }
  }
  return 0;
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK ProcessCallback(UnityAudioEffectState* state, float* inbuffer, float* outbuffer, unsigned int length, int inchannels, int outchannels)
    {
        EffectData::Data* data = &state->GetEffectData<EffectData>()->data;
        float gain = powf(10.0f, 0.05f * data->p[P_GAIN] + 2.5);
        float maxfreq = 0.25f * state->samplerate;
        float sampletime = 1.0f / (float)state->samplerate;
        float w0 = 0.5f * kPI * sampletime;
        float envdecay = 1.0f - powf(0.001f, sampletime / data->p[P_ENVDECAY]);
        float emph = data->p[P_EMPHASIS];
        for (int j = 0; j < NUMBANDS; j++)
        {
            float f = 0.25f * (freqs[j] * data->p[P_FMTSCALE] + data->p[P_FMTSHIFT]);
            if (f < 10.0f)
                f = 10.0f;
            else if (f > maxfreq)
                f = maxfreq;
            float w = f * w0;
            float ra = data->p[P_ANALYSISBW];
            float ca = 2.0f * sinf(w);
            float rs = data->p[P_SYNTHESISBW];
            float cs = 2.0f * sinf(w);
            for (int i = 0; i < inchannels; i++)
            {
                data->bands[i][j].analysis1.cutoff = ca;
                data->bands[i][j].analysis2.cutoff = ca;
                data->bands[i][j].analysis1.bandwidth = ra;
                data->bands[i][j].analysis2.bandwidth = ra;
                data->bands[i][j].synthesis1.cutoff = cs;
                data->bands[i][j].synthesis2.cutoff = cs;
                data->bands[i][j].synthesis1.bandwidth = rs;
                data->bands[i][j].synthesis2.bandwidth = rs;
            }
            gain *= emph;
        }

        float* sidechainBuffer = state->sidechainbuffer;
        for (unsigned int n = 0; n < length; n++)
        {
            for (int i = 0; i < inchannels; i++)
            {
                float input = (*inbuffer++) * gain + 1.0e-11f;
                float sidechainInput = *sidechainBuffer++;
                float sum = 0.0f;
                Band* b = data->bands[i];
                Band* b_end = b + NUMBANDS;
                while (b != b_end)
                {
                    float carrier = b->synthesis2.ProcessBPF(b->synthesis1.ProcessBPF(input));
                    float source = b->analysis2.ProcessBPF(b->analysis1.ProcessBPF(sidechainInput));
                    float env = b->envfollow.Process(source, envdecay);
                    sum += carrier * env;
                    ++b;
                }
                *outbuffer++ = sum;
            }
        }

        return UNITY_AUDIODSP_OK;
    }